

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

sqlite3_value * sqlite3VdbeGetBoundValue(Vdbe *v,int iVar,u8 aff)

{
  ushort uVar1;
  Mem *pMVar2;
  sqlite3 *db;
  Mem *unaff_RBX;
  
  if (v != (Vdbe *)0x0) {
    pMVar2 = v->aVar;
    uVar1 = pMVar2[(long)iVar + -1].flags;
    if ((uVar1 & 1) == 0) {
      db = v->db;
      unaff_RBX = (Mem *)sqlite3DbMallocZero(db,0x38);
      if (unaff_RBX != (Mem *)0x0) {
        unaff_RBX->flags = 1;
        unaff_RBX->db = db;
        sqlite3VdbeMemCopy(unaff_RBX,pMVar2 + (long)iVar + -1);
      }
    }
    if ((uVar1 & 1) == 0) {
      return unaff_RBX;
    }
  }
  return (sqlite3_value *)0x0;
}

Assistant:

SQLITE_PRIVATE sqlite3_value *sqlite3VdbeGetBoundValue(Vdbe *v, int iVar, u8 aff){
  assert( iVar>0 );
  if( v ){
    Mem *pMem = &v->aVar[iVar-1];
    assert( (v->db->flags & SQLITE_EnableQPSG)==0 );
    if( 0==(pMem->flags & MEM_Null) ){
      sqlite3_value *pRet = sqlite3ValueNew(v->db);
      if( pRet ){
        sqlite3VdbeMemCopy((Mem *)pRet, pMem);
        sqlite3ValueApplyAffinity(pRet, aff, SQLITE_UTF8);
      }
      return pRet;
    }
  }
  return 0;
}